

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# web.cpp
# Opt level: O3

void __thiscall Web_Constraint::Constraint_Removed(Web_Constraint *this,Am_Slot *removing_slot)

{
  bool bVar1;
  Output_Port **ppOVar2;
  Output_Port *pOVar3;
  Output_Port *ptr;
  Am_Web_Data *this_00;
  
  ptr = this->owner->out_list;
  if (ptr != (Output_Port *)0x0) {
    if ((ptr->context).data == removing_slot->data) {
      pOVar3 = (Output_Port *)0x0;
    }
    else {
      do {
        pOVar3 = ptr;
        ptr = pOVar3->next;
        if (ptr == (Output_Port *)0x0) {
          return;
        }
      } while ((ptr->context).data != removing_slot->data);
    }
    ppOVar2 = &pOVar3->next;
    if (pOVar3 == (Output_Port *)0x0) {
      ppOVar2 = &this->owner->out_list;
    }
    *ppOVar2 = ptr->next;
    ptr->next = (Output_Port *)0x0;
    Dyn_Memory_Manager::Delete(&Output_Port::memory,ptr);
    this_00 = this->owner;
    if (this_00->create_proc != (Am_Web_Create_Proc *)0x0) {
      bVar1 = (*this_00->create_proc)(removing_slot);
      this_00 = this->owner;
      if (bVar1) {
        if (this_00->in_list != (Input_Port *)0x0) {
          Input_Port::Destroy(this_00->in_list,&this->super_Am_Constraint);
          this_00 = this->owner;
          this_00->in_list = (Input_Port *)0x0;
        }
        if (this_00->out_list != (Output_Port *)0x0) {
          Output_Port::Destroy(this_00->out_list,&this->super_Am_Constraint);
          this_00 = this->owner;
          this_00->out_list = (Output_Port *)0x0;
        }
      }
    }
    if ((this_00->in_list == (Input_Port *)0x0) && (this_00->out_list == (Output_Port *)0x0)) {
      Am_Web_Data::~Am_Web_Data(this_00);
      operator_delete(this_00);
      return;
    }
  }
  return;
}

Assistant:

void
Web_Constraint::Constraint_Removed(const Am_Slot &removing_slot)
{
  Output_Port *prev = nullptr;
  Output_Port *curr = owner->out_list;
  while (curr) {
    if (curr->context == removing_slot) {
      if (prev)
        prev->next = curr->next;
      else
        owner->out_list = curr->next;
      curr->next = nullptr;
      delete curr;
      if (owner->create_proc && owner->create_proc(removing_slot)) {
        if (owner->in_list) {
          owner->in_list->Destroy(this);
          owner->in_list = nullptr;
        }
        if (owner->out_list) {
          owner->out_list->Destroy(this);
          owner->out_list = nullptr;
        }
      }
      if (!owner->in_list && !owner->out_list)
        delete owner;
      break;
    }
    prev = curr;
    curr = curr->next;
  }
}